

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool duckdb::Hugeint::TryConvert<char_const*>(char *value,hugeint_t *result)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 in_R8B;
  string_t input;
  string_t string_val;
  undefined4 uStack_1c;
  undefined8 uStack_18;
  
  sVar3 = strlen(value);
  uVar2 = (uint)sVar3;
  if (uVar2 < 0xd) {
    uStack_18._4_4_ = 0;
    uStack_1c = 0;
    uStack_18._0_4_ = 0;
    uStack_18 = (char *)0x0;
    if (uVar2 != 0) {
      switchD_00b1422a::default(&uStack_1c,value,(ulong)(uVar2 & 0xf));
      uStack_18 = (char *)CONCAT44(uStack_18._4_4_,(undefined4)uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)value;
    uStack_18 = value;
  }
  input.value.pointer.ptr = (char *)result;
  input.value._0_8_ = uStack_18;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
                    ((TryCast *)CONCAT44(uStack_1c,uVar2),input,(hugeint_t *)&DAT_00000001,
                     (bool)in_R8B);
  return bVar1;
}

Assistant:

bool Hugeint::TryConvert(const char *value, hugeint_t &result) {
	auto len = strlen(value);
	string_t string_val(value, UnsafeNumericCast<uint32_t>(len));
	return TryCast::Operation<string_t, hugeint_t>(string_val, result, true);
}